

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.h
# Opt level: O2

void __thiscall
KDTree<YaoMST::PointPair,_2,_YaoMST::NewAt>::anyGreater
          (KDTree<YaoMST::PointPair,_2,_YaoMST::NewAt> *this,PointPair *pt,PointPair *l,PointPair *r
          )

{
  int iVar1;
  PointPair *pPVar2;
  bool bVar3;
  int d;
  ulong uVar4;
  PointPair *pPVar5;
  
  do {
    if (r < l || (long)r - (long)l == 0) {
      return;
    }
    pPVar5 = l + ((long)r - (long)l) / 0x50;
    pPVar2 = this->first;
    bVar3 = true;
    for (uVar4 = 0; (bVar3 && (uVar4 < 2)); uVar4 = uVar4 + 1) {
      bVar3 = (&(pt->nPoint).x)[uVar4] <= (&(pPVar5->nPoint).x)[uVar4];
    }
    if (bVar3) {
      this->found = true;
      return;
    }
    anyGreater(this,pt,pPVar5 + 1,r);
    if (this->found != false) {
      return;
    }
    iVar1 = *(int *)((long)(this->split).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + ((long)pPVar5 - (long)pPVar2) / 10);
    r = pPVar5;
  } while ((&(pt->nPoint).x)[iVar1] <= (&(pPVar5->nPoint).x)[iVar1]);
  return;
}

Assistant:

void anyGreater(const Point &pt, Point *l, Point *r)
	{
		if (l >= r) return;
		auto mid = l + (r - l) / 2;
		auto midIndex = mid - first;
		bool check = true;
		for (int d = 0; d < K && check; ++d)
			check &= coordinate(*mid, d) >= coordinate(pt, d);
		if (check)
			return void(found = true);
		anyGreater(pt, mid + 1, r);
		if (!found && coordinate(pt, split[midIndex]) <= coordinate(*mid, split[midIndex]))
			anyGreater(pt, l, mid);
	}